

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall String::attach(String *this,char *str,usize length)

{
  uint64 uVar1;
  usize length_local;
  char *str_local;
  String *this_local;
  
  if (((this->data->ref != 0) && (uVar1 = Atomic::decrement(&this->data->ref), uVar1 == 0)) &&
     (this->data != (Data *)0x0)) {
    operator_delete__(this->data);
  }
  this->data = &this->_data;
  (this->_data).ref = 0;
  (this->_data).str = str;
  (this->_data).len = length;
  return;
}

Assistant:

void attach(const char* str, usize length)
  {
    if(data->ref && Atomic::decrement(data->ref) == 0)
        delete[] (char*)data;
    data = &_data;
    _data.ref = 0;
    _data.str = str;
    _data.len = length;
  }